

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O0

AffineSpace3fa *
embree::calculate_interpolated_space(ISPCInstanceArray *instanceArray,uint primID,float gtime)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  uint in_EDX;
  long in_RSI;
  AffineSpace3fa *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float ftime;
  int itime;
  float time;
  int time_segments;
  int local_e90;
  int local_e8c;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_d78;
  undefined8 uStack_d70;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  
  if (*(int *)(in_RSI + 0x28) == 1) {
    puVar2 = (undefined8 *)(**(long **)(in_RSI + 0x38) + (ulong)in_EDX * 0x40);
    uVar1 = puVar2[1];
    *(undefined8 *)&(in_RDI->l).vx.field_0 = *puVar2;
    *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8) = uVar1;
    uVar1 = puVar2[3];
    *(undefined8 *)&(in_RDI->l).vy.field_0 = puVar2[2];
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uVar1;
    uVar1 = puVar2[5];
    *(undefined8 *)&(in_RDI->l).vz.field_0 = puVar2[4];
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uVar1;
    uVar1 = puVar2[7];
    *(undefined8 *)&(in_RDI->p).field_0 = puVar2[6];
    *(undefined8 *)((long)&(in_RDI->p).field_0 + 8) = uVar1;
  }
  else {
    local_e8c = *(int *)(in_RSI + 0x28);
    fVar3 = in_XMM0_Da * (float)(local_e8c + -1);
    fVar4 = floorf(fVar3);
    local_e8c = local_e8c + -2;
    if ((int)fVar4 < local_e8c) {
      local_e8c = (int)fVar4;
    }
    local_e90 = 0;
    if (-1 < local_e8c) {
      local_e90 = local_e8c;
    }
    fVar3 = fVar3 - (float)local_e90;
    fVar4 = 1.0 - fVar3;
    local_4c8 = (float)local_df8;
    fStack_4c4 = (float)((ulong)local_df8 >> 0x20);
    fStack_4c0 = (float)uStack_df0;
    fStack_4bc = (float)((ulong)uStack_df0 >> 0x20);
    local_218 = (float)local_e78;
    fStack_214 = (float)((ulong)local_e78 >> 0x20);
    fStack_210 = (float)uStack_e70;
    fStack_20c = (float)((ulong)uStack_e70 >> 0x20);
    local_a78 = (float)local_d78;
    fStack_a74 = (float)((ulong)local_d78 >> 0x20);
    fStack_a70 = (float)uStack_d70;
    fStack_a6c = (float)((ulong)uStack_d70 >> 0x20);
    local_a88 = (float)local_e08;
    fStack_a84 = (float)((ulong)local_e08 >> 0x20);
    fStack_a80 = (float)uStack_e00;
    fStack_a7c = (float)((ulong)uStack_e00 >> 0x20);
    *(ulong *)&(in_RDI->l).vx.field_0 =
         CONCAT44(fVar4 * fStack_4c4 + fVar3 * fStack_214,fVar4 * local_4c8 + fVar3 * local_218);
    *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8) =
         CONCAT44(fVar4 * fStack_4bc + fVar3 * fStack_20c,fVar4 * fStack_4c0 + fVar3 * fStack_210);
    *(undefined8 *)&(in_RDI->l).vy.field_0 = local_198;
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_190;
    *(undefined8 *)&(in_RDI->l).vz.field_0 = local_1a8;
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_1a0;
    *(ulong *)&(in_RDI->p).field_0 = CONCAT44(fStack_a74 + fStack_a84,local_a78 + local_a88);
    *(ulong *)((long)&(in_RDI->p).field_0 + 8) =
         CONCAT44(fStack_a6c + fStack_a7c,fStack_a70 + fStack_a80);
  }
  return in_RDI;
}

Assistant:

AffineSpace3fa calculate_interpolated_space (ISPCInstanceArray* instanceArray, unsigned int primID, float gtime)
{
  if (instanceArray->numTimeSteps == 1)
    return AffineSpace3fa(instanceArray->spaces_array[0][primID]);

   /* calculate time segment itime and fractional time ftime */
  const int time_segments = instanceArray->numTimeSteps-1;
  const float time = gtime*(float)(time_segments);
  const int itime = clamp((int)(floor(time)),(int)0,time_segments-1);
  const float ftime = time - (float)(itime);
  return (1.0f-ftime)*AffineSpace3fa(instanceArray->spaces_array[itime+0][primID]) + ftime*AffineSpace3fa(instanceArray->spaces_array[itime+1][primID]);
}